

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_sel_scope(int scope,void *x,int n,char *op,int type,int contribute)

{
  int iVar1;
  char *in_RCX;
  undefined8 *in_RSI;
  int in_EDI;
  int in_R8D;
  anon_struct_16_2_20ca8ba2_conflict1 out_4;
  anon_struct_16_2_20ca8ba2_conflict1 in_4;
  anon_struct_8_2_19f72926_conflict out_3;
  anon_struct_8_2_19f72926_conflict in_3;
  anon_struct_16_2_20ca8ba2_conflict out_2;
  anon_struct_16_2_20ca8ba2_conflict in_2;
  anon_struct_16_2_20ca8ba2 out_1;
  anon_struct_16_2_20ca8ba2 in_1;
  anon_struct_8_2_19f72926 out;
  anon_struct_8_2_19f72926 in;
  MPI_Datatype type_1 [2];
  MPI_Aint disp [2];
  int block [2];
  MPI_Comm comm;
  MPI_Op mpi_op;
  undefined1 auStackY_e8 [4];
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  MPI_Comm *in_stack_ffffffffffffff28;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffff30;
  comex_group_t in_stack_ffffffffffffff34;
  undefined1 local_c8 [8];
  undefined4 local_c0;
  int local_bc;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  int local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  int local_80;
  undefined1 local_78 [8];
  undefined4 local_70;
  int local_6c;
  undefined *local_68;
  undefined *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_40;
  comex_group_t in_stack_ffffffffffffffc4;
  MPI_Comm local_38;
  undefined *local_30;
  
  local_30 = &ompi_mpi_op_null;
  local_38 = get_default_comm();
  if (in_EDI == 0x151) {
    if (_number_of_procs_per_node == 1) {
      local_38 = (MPI_Comm)&ompi_mpi_comm_self;
    }
    else {
      comex_group_comm(in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
    }
  }
  if (armci_msg_sel_scope::initialized == 0) {
    armci_msg_sel_scope::initialized = 1;
    local_68 = &ompi_mpi_long_long_int;
    local_60 = &ompi_mpi_int;
    local_58 = 0;
    local_50 = 8;
    local_40 = 1;
    in_stack_ffffffffffffffc4 = 1;
    MPI_Type_create_struct(2,&local_40,&local_58,&local_68,&MPI_LONGLONG_INT);
  }
  iVar1 = strncmp(in_RCX,"min",3);
  if (iVar1 == 0) {
    local_30 = &ompi_mpi_op_minloc;
  }
  else {
    iVar1 = strncmp(in_RCX,"max",3);
    if (iVar1 == 0) {
      local_30 = &ompi_mpi_op_maxloc;
    }
    else {
      comex_error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
  }
  if (in_R8D == -99) {
    local_70 = *(undefined4 *)in_RSI;
    local_6c = get_default_rank();
    if (in_EDI != 0x151) {
      comex_barrier(in_stack_ffffffffffffffc4);
    }
    MPI_Allreduce(&local_70,local_78,1,&ompi_mpi_2int,local_30,local_38);
    armci_msg_bcast((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28);
  }
  else if (in_R8D == -0x65) {
    local_88 = *in_RSI;
    local_80 = get_default_rank();
    if (in_EDI != 0x151) {
      comex_barrier(in_stack_ffffffffffffffc4);
    }
    MPI_Allreduce(&local_88,local_98,1,&ompi_mpi_long_int,local_30,local_38);
    armci_msg_bcast((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28);
  }
  else if (in_R8D == -0x66) {
    local_a8 = *in_RSI;
    local_a0 = get_default_rank();
    if (in_EDI != 0x151) {
      comex_barrier(in_stack_ffffffffffffffc4);
    }
    MPI_Allreduce(&local_a8,local_b8,1,MPI_LONGLONG_INT,local_30,local_38);
    armci_msg_bcast((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28);
  }
  else if (in_R8D == -0x132) {
    local_c0 = *(undefined4 *)in_RSI;
    local_bc = get_default_rank();
    if (in_EDI != 0x151) {
      comex_barrier(in_stack_ffffffffffffffc4);
    }
    MPI_Allreduce(&local_c0,local_c8,1,&ompi_mpi_float_int,local_30,local_38);
    armci_msg_bcast((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28);
  }
  else if (in_R8D == -0x133) {
    uVar2 = *in_RSI;
    iVar1 = get_default_rank();
    if (in_EDI != 0x151) {
      comex_barrier(in_stack_ffffffffffffffc4);
    }
    MPI_Allreduce(&stack0xffffffffffffff28,auStackY_e8,1,&ompi_mpi_double_int,local_30,local_38);
    armci_msg_bcast((void *)CONCAT44(in_stack_ffffffffffffff34,iVar1),(int)((ulong)uVar2 >> 0x20),
                    (int)uVar2);
  }
  else {
    comex_error(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  return;
}

Assistant:

void armci_msg_sel_scope(int scope, void *x, int n, char* op, int type, int contribute)
{
    static int initialized = 0;
    MPI_Op mpi_op = MPI_OP_NULL;
    MPI_Comm comm = get_default_comm();

    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node == 1) {
        comm = MPI_COMM_SELF;
      } else {
        comex_group_comm(ARMCI_Node_group,&comm);
      }
    }

    /* first time this function is called we establish the
     * long long w/ int type that MPI doesn't provide by default */
    if (!initialized) {
        int block[2];
        MPI_Aint disp[2];
        MPI_Datatype type[2];

        initialized = 1;
        type[0] = MPI_LONG_LONG;
        type[1] = MPI_INT;
        disp[0] = 0;
        disp[1] = sizeof(long long);
        block[0] = 1;
        block[1] = 1;
#if defined(MPI_VERSION) && (MPI_VERSION >= 2)
        MPI_Type_create_struct(2, block, disp, type, &MPI_LONGLONG_INT);
#else
        MPI_Type_struct(2, block, disp, type, &MPI_LONGLONG_INT);
#endif
    }

    if (strncmp(op, "min", 3) == 0) {
        mpi_op = MPI_MINLOC;
    }
    else if (strncmp(op, "max", 3) == 0) {
        mpi_op = MPI_MAXLOC;
    }
    else {
        comex_error("unsupported armci_msg_sel_scope operation", 1);
    }

#define SELECT(ARMCI_TYPE, C_TYPE, MPI_TYPE)                    \
    if (type == ARMCI_TYPE) {                                   \
        struct {                                                \
            C_TYPE val;                                         \
            int rank;                                           \
        } in, out;                                              \
        in.val = *((C_TYPE*)x);                                 \
        in.rank = get_default_rank();                           \
        if (SCOPE_NODE != scope) {                              \
            comex_barrier(ARMCI_Default_Proc_Group);            \
        }                                                       \
        MPI_Allreduce(&in, &out, 1, MPI_TYPE, mpi_op, comm);    \
        armci_msg_bcast(x, n, out.rank);                        \
    }                                                           \
    else
    SELECT(ARMCI_INT,       int,        MPI_2INT)
    SELECT(ARMCI_LONG,      long,       MPI_LONG_INT)
    SELECT(ARMCI_LONG_LONG, long long,  MPI_LONGLONG_INT)
    SELECT(ARMCI_FLOAT,     float,      MPI_FLOAT_INT)
    SELECT(ARMCI_DOUBLE,    double,     MPI_DOUBLE_INT)
    {
        comex_error("unsupported SELECT operation", 1);
    }
#undef SELECT
}